

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O2

re_t re_compile(char *pattern)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  uchar uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  
  uVar2 = 0;
  iVar3 = 1;
  uVar4 = 0;
LAB_0010f39d:
  iVar7 = (int)uVar4;
  lVar6 = (long)iVar7;
  uVar5 = pattern[lVar6];
  if ((uVar5 == '\0') || (0x1c < uVar2)) {
    re_compile::re_compiled[uVar2 & 0xffffffff].type = '\0';
    return re_compile::re_compiled;
  }
  if (uVar5 == '$') {
    re_compile::re_compiled[uVar2].type = '\x03';
  }
  else if (uVar5 == '*') {
    re_compile::re_compiled[uVar2].type = '\x05';
  }
  else if (uVar5 == '+') {
    re_compile::re_compiled[uVar2].type = '\x06';
  }
  else if (uVar5 == '.') {
    re_compile::re_compiled[uVar2].type = '\x01';
  }
  else if (uVar5 == '?') {
    re_compile::re_compiled[uVar2].type = '\x04';
  }
  else {
    if (uVar5 == '[') {
      if (pattern[lVar6 + 1] == '^') {
        uVar4 = lVar6 + 1U & 0xffffffff;
      }
      re_compile::re_compiled[uVar2].type = pattern[lVar6 + 1] == '^' | 8;
      iVar8 = iVar3;
      do {
        lVar6 = (long)(int)uVar4;
        uVar5 = pattern[lVar6 + 1];
        if (uVar5 == '\\') {
          if (0x26 < iVar8) {
            return (re_t)0x0;
          }
          iVar7 = iVar8 + 1;
          re_compile::ccl_buf[iVar8] = '\\';
          uVar5 = pattern[lVar6 + 2];
          uVar4 = lVar6 + 2;
        }
        else {
          uVar4 = lVar6 + 1;
          iVar7 = (int)uVar4;
          if ((uVar5 == '\0') || (uVar5 == ']')) goto LAB_0010f540;
          iVar7 = iVar8;
          if (0x27 < iVar8) {
            return (re_t)0x0;
          }
        }
        iVar8 = iVar7 + 1;
        re_compile::ccl_buf[iVar7] = uVar5;
      } while( true );
    }
    if (uVar5 == '\\') {
      cVar1 = pattern[lVar6 + 1];
      if (cVar1 != '\0') {
        if (cVar1 == 'D') {
          re_compile::re_compiled[uVar2].type = '\v';
        }
        else if (cVar1 == 'S') {
          re_compile::re_compiled[uVar2].type = '\x0f';
        }
        else if (cVar1 == 'W') {
          re_compile::re_compiled[uVar2].type = '\r';
        }
        else if (cVar1 == 'w') {
          re_compile::re_compiled[uVar2].type = '\f';
        }
        else if (cVar1 == 's') {
          re_compile::re_compiled[uVar2].type = '\x0e';
        }
        else if (cVar1 == 'd') {
          re_compile::re_compiled[uVar2].type = '\n';
        }
        else {
          re_compile::re_compiled[uVar2].type = '\a';
          re_compile::re_compiled[uVar2].field_1.ch = pattern[lVar6 + 1];
        }
        iVar7 = (int)(lVar6 + 1);
      }
    }
    else if (uVar5 == '^') {
      re_compile::re_compiled[uVar2].type = '\x02';
    }
    else {
      re_compile::re_compiled[uVar2].type = '\a';
      re_compile::re_compiled[uVar2].field_1.ch = uVar5;
    }
  }
  goto LAB_0010f591;
LAB_0010f540:
  if (0x27 < iVar8) {
    return (re_t)0x0;
  }
  re_compile::ccl_buf[iVar8] = '\0';
  re_compile::re_compiled[uVar2].field_1.ccl = re_compile::ccl_buf + iVar3;
  iVar3 = iVar8 + 1;
LAB_0010f591:
  uVar2 = uVar2 + 1;
  uVar4 = (ulong)(iVar7 + 1);
  goto LAB_0010f39d;
}

Assistant:

re_t re_compile(const char* pattern)
{
  /* The sizes of the two static arrays below substantiates the static RAM usage of this module.
     MAX_REGEXP_OBJECTS is the max number of symbols in the expression.
     MAX_CHAR_CLASS_LEN determines the size of buffer for chars in all char-classes in the expression. */
  static regex_t re_compiled[MAX_REGEXP_OBJECTS];
  static unsigned char ccl_buf[MAX_CHAR_CLASS_LEN];
  int ccl_bufidx = 1;

  char c;     /* current char in pattern   */
  int i = 0;  /* index into pattern        */
  int j = 0;  /* index into re_compiled    */

  while (pattern[i] != '\0' && (j+1 < MAX_REGEXP_OBJECTS))
  {
    c = pattern[i];

    switch (c)
    {
      /* Meta-characters: */
      case '^': {    re_compiled[j].type = BEGIN;           } break;
      case '$': {    re_compiled[j].type = END;             } break;
      case '.': {    re_compiled[j].type = DOT;             } break;
      case '*': {    re_compiled[j].type = STAR;            } break;
      case '+': {    re_compiled[j].type = PLUS;            } break;
      case '?': {    re_compiled[j].type = QUESTIONMARK;    } break;
/*    case '|': {    re_compiled[j].type = BRANCH;          } break; <-- not working properly */

      /* Escaped character-classes (\s \w ...): */
      case '\\':
      {
        if (pattern[i+1] != '\0')
        {
          /* Skip the escape-char '\\' */
          i += 1;
          /* ... and check the next */
          switch (pattern[i])
          {
            /* Meta-character: */
            case 'd': {    re_compiled[j].type = DIGIT;            } break;
            case 'D': {    re_compiled[j].type = NOT_DIGIT;        } break;
            case 'w': {    re_compiled[j].type = ALPHA;            } break;
            case 'W': {    re_compiled[j].type = NOT_ALPHA;        } break;
            case 's': {    re_compiled[j].type = WHITESPACE;       } break;
            case 'S': {    re_compiled[j].type = NOT_WHITESPACE;   } break;

            /* Escaped character, e.g. '.' or '$' */ 
            default:  
            {
              re_compiled[j].type = CHAR;
              re_compiled[j].ch = pattern[i];
            } break;
          }
        }
        /* '\\' as last char in pattern -> invalid regular expression. */
/*
        else
        { 
          re_compiled[j].type = CHAR;
          re_compiled[j].ch = pattern[i];
        }
*/
      } break;

      /* Character class: */
      case '[':
      {
        /* Remember where the char-buffer starts. */
        int buf_begin = ccl_bufidx;

        /* Look-ahead to determine if negated */
        if (pattern[i+1] == '^')
        {
          re_compiled[j].type = INV_CHAR_CLASS;
          i += 1; /* Increment i to avoid including '^' in the char-buffer */
        }  
        else
        {
          re_compiled[j].type = CHAR_CLASS;
        }

        /* Copy characters inside [..] to buffer */
        while (    (pattern[++i] != ']')
                && (pattern[i]   != '\0')) /* Missing ] */
        {
          if (pattern[i] == '\\')
          {
            if (ccl_bufidx >= MAX_CHAR_CLASS_LEN - 1)
            {
              //fputs("exceeded internal buffer!\n", stderr);
              return 0;
            }
            ccl_buf[ccl_bufidx++] = pattern[i++];
          }
          else if (ccl_bufidx >= MAX_CHAR_CLASS_LEN)
          {
              //fputs("exceeded internal buffer!\n", stderr);
              return 0;
          }
          ccl_buf[ccl_bufidx++] = pattern[i];
        }
        if (ccl_bufidx >= MAX_CHAR_CLASS_LEN)
        {
            /* Catches cases such as [00000000000000000000000000000000000000][ */
            //fputs("exceeded internal buffer!\n", stderr);
            return 0;
        }
        /* Null-terminate string end */
        ccl_buf[ccl_bufidx++] = 0;
        re_compiled[j].ccl = &ccl_buf[buf_begin];
      } break;

      /* Other characters: */
      default:
      {
        re_compiled[j].type = CHAR;
        re_compiled[j].ch = c;
      } break;
    }
    i += 1;
    j += 1;
  }
  /* 'UNUSED' is a sentinel used to indicate end-of-pattern */
  re_compiled[j].type = UNUSED;

  return (re_t) re_compiled;
}